

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O1

void __thiscall
btGeneric6DofSpring2Constraint::setStiffness
          (btGeneric6DofSpring2Constraint *this,int index,btScalar stiffness,bool limitIfNeeded)

{
  if (index < 3) {
    (this->m_linearLimits).m_springStiffness.m_floats[index] = stiffness;
    (this->m_linearLimits).m_springStiffnessLimited[index] = limitIfNeeded;
    return;
  }
  this->m_angularLimits[index - 3U].m_springStiffness = stiffness;
  this->m_angularLimits[index - 3U].m_springStiffnessLimited = limitIfNeeded;
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::setStiffness(int index, btScalar stiffness, bool limitIfNeeded)
{
	btAssert((index >= 0) && (index < 6));
	if (index<3) {
		m_linearLimits.m_springStiffness[index] = stiffness;
		m_linearLimits.m_springStiffnessLimited[index] = limitIfNeeded;
	} else {
		m_angularLimits[index - 3].m_springStiffness = stiffness;
		m_angularLimits[index - 3].m_springStiffnessLimited = limitIfNeeded;
	}
}